

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_surjectionproof_parse
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,uchar *input,size_t inputlen)

{
  ulong uVar1;
  size_t sVar2;
  size_t __n;
  uchar padding_mask;
  size_t signature_len;
  size_t n_inputs;
  size_t inputlen_local;
  uchar *input_local;
  secp256k1_surjectionproof *proof_local;
  secp256k1_context *ctx_local;
  
  if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (input == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (inputlen < 2) {
    ctx_local._4_4_ = 0;
  }
  else {
    uVar1 = (long)(int)((uint)input[1] << 8) + (ulong)*input;
    if (uVar1 < 0x101) {
      if (inputlen < (uVar1 + 7 >> 3) + 2) {
        ctx_local._4_4_ = 0;
      }
      else if (((uVar1 & 7) == 0) ||
              ((input[(uVar1 + 7 >> 3) + 1] & (byte)(-1 << ((byte)uVar1 & 7))) == 0)) {
        sVar2 = secp256k1_count_bits_set(input + 2,uVar1 + 7 >> 3);
        __n = (sVar2 + 1) * 0x20;
        if (inputlen == (uVar1 + 7 >> 3) + 2 + __n) {
          proof->n_inputs = uVar1;
          memcpy(proof->used_inputs,input + 2,uVar1 + 7 >> 3);
          memcpy(proof->data,input + (uVar1 + 7 >> 3) + 2,__n);
          ctx_local._4_4_ = 1;
        }
        else {
          ctx_local._4_4_ = 0;
        }
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_surjectionproof_parse(const secp256k1_context* ctx, secp256k1_surjectionproof *proof, const unsigned char *input, size_t inputlen) {
    size_t n_inputs;
    size_t signature_len;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(input != NULL);
    (void) ctx;

    if (inputlen < 2) {
        return 0;
    }
    n_inputs = ((size_t) (input[1] << 8)) + input[0];
    if (n_inputs > SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS) {
        return 0;
    }
    if (inputlen < 2 + (n_inputs + 7) / 8) {
        return 0;
    }

    /* Check that the bitvector of used inputs is of the claimed
     * length; i.e. the final byte has no "padding bits" set */
    if (n_inputs % 8 != 0) {
        const unsigned char padding_mask = (~0U) << (n_inputs % 8);
        if ((input[2 + (n_inputs + 7) / 8 - 1] & padding_mask) != 0) {
            return 0;
        }
    }

    signature_len = 32 * (1 + secp256k1_count_bits_set(&input[2], (n_inputs + 7) / 8));
    if (inputlen != 2 + (n_inputs + 7) / 8 + signature_len) {
        return 0;
    }
    proof->n_inputs = n_inputs;
    memcpy(proof->used_inputs, &input[2], (n_inputs + 7) / 8);
    memcpy(proof->data, &input[2 + (n_inputs + 7) / 8], signature_len);

    return 1;
}